

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unifiedcache.cpp
# Opt level: O0

void __thiscall icu_63::UnifiedCache::UnifiedCache(UnifiedCache *this,UErrorCode *status)

{
  UBool UVar1;
  SharedObject *this_00;
  UHashtable *pUVar2;
  UErrorCode *size;
  SharedObject *local_48;
  UErrorCode *status_local;
  UnifiedCache *this_local;
  
  size = status;
  UnifiedCacheBase::UnifiedCacheBase(&this->super_UnifiedCacheBase);
  (this->super_UnifiedCacheBase).super_UObject._vptr_UObject =
       (_func_int **)&PTR__UnifiedCache_004b7030;
  this->fHashtable = (UHashtable *)0x0;
  this->fEvictPos = -1;
  this->fNumValuesTotal = 0;
  this->fNumValuesInUse = 0;
  this->fMaxUnused = 1000;
  this->fMaxPercentageOfInUse = 100;
  this->fAutoEvictedCount = 0;
  this->fNoValue = (SharedObject *)0x0;
  UVar1 = ::U_FAILURE(*status);
  if (UVar1 == '\0') {
    this_00 = (SharedObject *)UMemory::operator_new((UMemory *)0x18,(size_t)size);
    local_48 = (SharedObject *)0x0;
    if (this_00 != (SharedObject *)0x0) {
      SharedObject::SharedObject(this_00);
      local_48 = this_00;
    }
    this->fNoValue = local_48;
    if (this->fNoValue == (SharedObject *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      this->fNoValue->softRefCount = 1;
      std::__atomic_base<int>::operator=(&(this->fNoValue->hardRefCount).super___atomic_base<int>,1)
      ;
      this->fNoValue->cachePtr = &this->super_UnifiedCacheBase;
      pUVar2 = uhash_open_63(ucache_hashKeys_63,ucache_compareKeys_63,(undefined1 *)0x0,status);
      this->fHashtable = pUVar2;
      UVar1 = ::U_FAILURE(*status);
      if (UVar1 == '\0') {
        uhash_setKeyDeleter_63(this->fHashtable,ucache_deleteKey_63);
      }
    }
  }
  return;
}

Assistant:

UnifiedCache::UnifiedCache(UErrorCode &status) :
        fHashtable(NULL),
        fEvictPos(UHASH_FIRST),
        fNumValuesTotal(0),
        fNumValuesInUse(0),
        fMaxUnused(DEFAULT_MAX_UNUSED),
        fMaxPercentageOfInUse(DEFAULT_PERCENTAGE_OF_IN_USE),
        fAutoEvictedCount(0),
        fNoValue(nullptr) {
    if (U_FAILURE(status)) {
        return;
    }
    fNoValue = new SharedObject();
    if (fNoValue == nullptr) {
        status = U_MEMORY_ALLOCATION_ERROR;
        return;
    }
    fNoValue->softRefCount = 1;  // Add fake references to prevent fNoValue from being deleted
    fNoValue->hardRefCount = 1;  // when other references to it are removed.
    fNoValue->cachePtr = this;

    fHashtable = uhash_open(
            &ucache_hashKeys,
            &ucache_compareKeys,
            NULL,
            &status);
    if (U_FAILURE(status)) {
        return;
    }
    uhash_setKeyDeleter(fHashtable, &ucache_deleteKey);
}